

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O2

SUNErrCode SUNAdaptController_SetParams_PI(SUNAdaptController C,sunrealtype k1,sunrealtype k2)

{
  sunrealtype *psVar1;
  
  psVar1 = (sunrealtype *)C->content;
  *psVar1 = k1;
  psVar1[1] = k2;
  psVar1[4] = 0.0;
  psVar1[2] = 0.0;
  psVar1[3] = 0.0;
  *(uint *)((long)psVar1 + 0x54) = -(uint)(k2 != 0.0) & 1;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_SetParams_Soderlind(SUNAdaptController C,
                                                  sunrealtype k1,
                                                  sunrealtype k2, sunrealtype k3,
                                                  sunrealtype k4, sunrealtype k5)
{
  SUNFunctionBegin(C->sunctx);
  SODERLIND_K1(C) = k1;
  SODERLIND_K2(C) = k2;
  SODERLIND_K3(C) = k3;
  SODERLIND_K4(C) = k4;
  SODERLIND_K5(C) = k5;

  if (k5 != SUN_RCONST(0.0) || k3 != SUN_RCONST(0.0))
  {
    SODERLIND_HISTORYSIZE(C) = 2;
  }
  else if (k4 != SUN_RCONST(0.0) || k2 != SUN_RCONST(0.0))
  {
    SODERLIND_HISTORYSIZE(C) = 1;
  }
  else { SODERLIND_HISTORYSIZE(C) = 0; }
  return SUN_SUCCESS;
}